

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select.c
# Opt level: O0

int Curl_socket_check(curl_socket_t readfd0,curl_socket_t readfd1,curl_socket_t writefd,
                     timediff_t timeout_ms)

{
  uint local_40;
  uint local_3c;
  int r;
  int num;
  pollfd pfd [3];
  timediff_t timeout_ms_local;
  curl_socket_t writefd_local;
  curl_socket_t readfd1_local;
  curl_socket_t readfd0_local;
  
  pfd[2] = (pollfd)timeout_ms;
  if (((readfd0 == -1) && (readfd1 == -1)) && (writefd == -1)) {
    readfd1_local = Curl_wait_ms(timeout_ms);
  }
  else {
    if (readfd0 != -1) {
      num._0_2_ = 0xc3;
      num._2_2_ = 0;
      r = readfd0;
    }
    local_3c = (uint)(readfd0 != -1);
    if (readfd1 != -1) {
      (&r)[(long)(int)local_3c * 2] = readfd1;
      pfd[(long)(int)local_3c + -1].events = 0xc3;
      pfd[(long)(int)local_3c + -1].revents = 0;
      local_3c = local_3c + 1;
    }
    if (writefd != -1) {
      (&r)[(long)(int)local_3c * 2] = writefd;
      pfd[(long)(int)local_3c + -1].events = 0x106;
      pfd[(long)(int)local_3c + -1].revents = 0;
      local_3c = local_3c + 1;
    }
    readfd1_local = Curl_poll((pollfd *)&r,local_3c,(timediff_t)pfd[2]);
    if (0 < readfd1_local) {
      local_40 = 0;
      local_3c = 0;
      if (readfd0 != -1) {
        local_40 = (uint)((num._2_2_ & 0x59) != 0);
        if ((num._2_2_ & 0xa2) != 0) {
          local_40 = local_40 | 4;
        }
        local_3c = 1;
      }
      if (readfd1 != -1) {
        if ((pfd[(long)(int)local_3c + -1].revents & 0x59U) != 0) {
          local_40 = local_40 | 8;
        }
        if ((pfd[(long)(int)local_3c + -1].revents & 0xa2U) != 0) {
          local_40 = local_40 | 4;
        }
        local_3c = local_3c + 1;
      }
      if (writefd != -1) {
        if ((pfd[(long)(int)local_3c + -1].revents & 0x104U) != 0) {
          local_40 = local_40 | 2;
        }
        if ((pfd[(long)(int)local_3c + -1].revents & 0x3aU) != 0) {
          local_40 = local_40 | 4;
        }
      }
      readfd1_local = local_40;
    }
  }
  return readfd1_local;
}

Assistant:

int Curl_socket_check(curl_socket_t readfd0, /* two sockets to read from */
                      curl_socket_t readfd1,
                      curl_socket_t writefd, /* socket to write to */
                      timediff_t timeout_ms) /* milliseconds to wait */
{
  struct pollfd pfd[3];
  int num;
  int r;

  if((readfd0 == CURL_SOCKET_BAD) && (readfd1 == CURL_SOCKET_BAD) &&
     (writefd == CURL_SOCKET_BAD)) {
    /* no sockets, just wait */
    return Curl_wait_ms(timeout_ms);
  }

  /* Avoid initial timestamp, avoid Curl_now() call, when elapsed
     time in this function does not need to be measured. This happens
     when function is called with a zero timeout or a negative timeout
     value indicating a blocking call should be performed. */

  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd0;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    pfd[num].fd = readfd1;
    pfd[num].events = POLLRDNORM|POLLIN|POLLRDBAND|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    pfd[num].fd = writefd;
    pfd[num].events = POLLWRNORM|POLLOUT|POLLPRI;
    pfd[num].revents = 0;
    num++;
  }

  r = Curl_poll(pfd, num, timeout_ms);
  if(r <= 0)
    return r;

  r = 0;
  num = 0;
  if(readfd0 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      r |= CURL_CSELECT_IN;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
    num++;
  }
  if(readfd1 != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLRDNORM|POLLIN|POLLERR|POLLHUP))
      r |= CURL_CSELECT_IN2;
    if(pfd[num].revents & (POLLRDBAND|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
    num++;
  }
  if(writefd != CURL_SOCKET_BAD) {
    if(pfd[num].revents & (POLLWRNORM|POLLOUT))
      r |= CURL_CSELECT_OUT;
    if(pfd[num].revents & (POLLERR|POLLHUP|POLLPRI|POLLNVAL))
      r |= CURL_CSELECT_ERR;
  }

  return r;
}